

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxwell_dist.hpp
# Opt level: O2

result_type_conflict2 __thiscall
trng::maxwell_dist<double>::icdf(maxwell_dist<double> *this,result_type_conflict2 x)

{
  int *piVar1;
  int iVar2;
  result_type_conflict2 rVar3;
  result_type_conflict2 rVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  if (0.0 <= x) {
    if (x <= 1.0) {
      if ((x == 1.0) && (!NAN(x))) {
        return INFINITY;
      }
      if ((x == 0.0) && (!NAN(x))) {
        return 0.0;
      }
      dVar6 = (this->P).theta_;
      iVar2 = 0x38;
      dVar6 = (dVar6 + dVar6) * 0.7978845608028654;
      do {
        iVar2 = iVar2 + -1;
        if (iVar2 == 0) {
          return dVar6;
        }
        rVar3 = cdf(this,dVar6);
        rVar4 = pdf(this,dVar6);
        dVar5 = dVar6 - (rVar3 - x) / rVar4;
        dVar7 = dVar5 / dVar6;
        dVar6 = dVar5;
      } while (8.881784197001252e-16 <= ABS(dVar7 + -1.0));
      return dVar5;
    }
  }
  piVar1 = __errno_location();
  *piVar1 = 0x21;
  return NAN;
}

Assistant:

icdf(result_type x) const {
      if (x < 0 or x > 1) {
#if !(defined TRNG_CUDA)
        errno = EDOM;
#endif
        return math::numeric_limits<result_type>::quiet_NaN();
      }
      if (x == 1)
        return math::numeric_limits<result_type>::infinity();
      if (x == 0)
        return 0;
      result_type y(2 * P.theta() * math::constants<result_type>::sqrt_2_over_pi);
      for (int i{0}; i < math::numeric_limits<result_type>::digits + 2; ++i) {
        result_type y_old = y;
        y -= (cdf(y) - x) / pdf(y);
        if (math::abs(y / y_old - 1) < 4 * math::numeric_limits<result_type>::epsilon())
          break;
      }
      return y;
    }